

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::UnicodeSetIterator::getString(UnicodeSetIterator *this)

{
  UnicodeString *pUVar1;
  size_t in_RSI;
  
  if (this->string != (UnicodeString *)0x0) {
    return this->string;
  }
  pUVar1 = this->cpString;
  if (pUVar1 == (UnicodeString *)0x0) {
    pUVar1 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,in_RSI);
    if (pUVar1 == (UnicodeString *)0x0) {
      this->cpString = (UnicodeString *)0x0;
      pUVar1 = (UnicodeString *)0x0;
      goto LAB_002d9df1;
    }
    (pUVar1->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003d8fe8;
    (pUVar1->fUnion).fStackFields.fLengthAndFlags = 2;
    this->cpString = pUVar1;
  }
  UnicodeString::setTo(pUVar1,this->codepoint);
  pUVar1 = this->cpString;
LAB_002d9df1:
  this->string = pUVar1;
  return pUVar1;
}

Assistant:

const UnicodeString& UnicodeSetIterator::getString()  {
    if (string==NULL && codepoint!=(UChar32)IS_STRING) {
       if (cpString == NULL) {
          cpString = new UnicodeString();
       }
       if (cpString != NULL) {
          cpString->setTo((UChar32)codepoint);
       }
       string = cpString;
    }
    return *string;
}